

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O3

void __thiscall
viennamath::rt_latex_translator<viennamath::rt_expression_interface<double>>::
customize<viennamath::rt_function_symbol<viennamath::rt_expression_interface<double>>>
          (rt_latex_translator<viennamath::rt_expression_interface<double>> *this,
          rt_function_symbol<viennamath::rt_expression_interface<double>_> *e,string *output)

{
  byte bVar1;
  ostream *poVar2;
  byte bVar3;
  undefined8 *puVar4;
  
  puVar4 = *(undefined8 **)this;
  if (puVar4 != *(undefined8 **)(this + 8)) {
    bVar3 = 0;
    do {
      bVar1 = (**(code **)(*(long *)*puVar4 + 0x10))((long *)*puVar4,e,output);
      bVar3 = bVar3 | bVar1;
      puVar4 = puVar4 + 1;
    } while (puVar4 != *(undefined8 **)(this + 8));
    if ((bVar3 & 1) != 0) {
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Warning: Cannot customize LaTeX translator for ",0x2f);
  poVar2 = operator<<((ostream *)&std::cerr,e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," (no suitable processor found)",0x1e);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void customize(ExpressionType const & e, std::string output)
      {
        bool found = false;
        for (typename ProcessorArray::const_iterator it = processors_.begin();
                                                     it != processors_.end();
                                                   ++it)
        {
          found |= (*it)->customize(&e, output);
        }

        if (!found)
          std::cerr << "Warning: Cannot customize LaTeX translator for " << e << " (no suitable processor found)" << std::endl;
        //variable_strings_[x.id()] = output;
      }